

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnDelegateExpr
          (BinaryReaderInterp *this,Index depth)

{
  u32 *puVar1;
  u32 *puVar2;
  pointer *ppLVar3;
  uint uVar4;
  pointer pHVar5;
  pointer pLVar6;
  pointer pLVar7;
  Result RVar8;
  Offset OVar9;
  Enum EVar10;
  Label *pLVar11;
  u32 *puVar12;
  ulong uVar13;
  Location loc_1;
  Location loc;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,depth,&loc_1);
  RVar8 = SharedValidator::OnDelegate(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar8.enum_ == Error) {
    EVar10 = Error;
  }
  else {
    pLVar11 = TopLabel(this);
    if (pLVar11->kind != Try) {
      __assert_fail("label->kind == LabelKind::Try",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6b4,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    uVar4 = pLVar11->handler_desc_index;
    pHVar5 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar5[uVar4].kind = Delegate;
    OVar9 = pLVar11->offset;
    Istream::Emit(this->istream_,Br);
    if (OVar9 != 0xffffffff) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x6b9,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                   );
    }
    pLVar6 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar7 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar9 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar6 - (long)pLVar7) >> 4) - 1,OVar9
                    );
    Istream::Emit(this->istream_,0xffffffff);
    OVar9 = Istream::end(this->istream_);
    pHVar5[uVar4].try_end_offset = OVar9;
    pLVar6 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (ulong)(depth + 1) - 1;
    puVar12 = &pLVar6[-(ulong)(depth + 1)].handler_desc_index;
    do {
      uVar13 = uVar13 + 1;
      if ((ulong)((long)pLVar6 -
                  (long)(this->label_stack_).
                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar13) {
        __assert_fail("target_label",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/binary-reader-interp.cc"
                      ,0x6be,
                      "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnDelegateExpr(Index)"
                     );
      }
      puVar1 = puVar12 + -4;
      puVar2 = puVar12 + -7;
      puVar12 = puVar1;
    } while (*puVar2 != 1);
    pHVar5[uVar4].field_4.catch_all_offset = *puVar1;
    FixupTopLabel(this);
    ppLVar3 = &(this->label_stack_).
               super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar3 = *ppLVar3 + -1;
    EVar10 = Ok;
  }
  return (Result)EVar10;
}

Assistant:

Result BinaryReaderInterp::OnDelegateExpr(Index depth) {
  CHECK_RESULT(validator_.OnDelegate(GetLocation(), Var(depth, GetLocation())));
  Label* label = TopLabel();
  assert(label->kind == LabelKind::Try);
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Delegate;
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  desc.try_end_offset = istream_.end();
  Label* target_label = GetNearestTryLabel(depth + 1);
  assert(target_label);
  desc.delegate_handler_index = target_label->handler_desc_index;
  FixupTopLabel();
  PopLabel();
  return Result::Ok;
}